

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportFileGenerator::GenerateCxxModuleInformation(cmExportFileGenerator *this,ostream *os)

{
  ulong uVar1;
  ostream *poVar2;
  undefined1 local_378 [8];
  cmGeneratedFileStream ap;
  cmAlphaNum local_e0;
  undefined1 local_b0 [8];
  string trampoline_path;
  undefined1 local_70 [8];
  string path;
  undefined1 local_38 [8];
  string cxx_module_dirname;
  ostream *os_local;
  cmExportFileGenerator *this_local;
  
  cxx_module_dirname.field_2._8_8_ = os;
  (*this->_vptr_cmExportFileGenerator[0x15])(local_38);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)cxx_module_dirname.field_2._8_8_,
                             "# Include C++ module properties\n");
    poVar2 = std::operator<<(poVar2,"include(\"${CMAKE_CURRENT_LIST_DIR}/");
    poVar2 = std::operator<<(poVar2,(string *)local_38);
    std::operator<<(poVar2,"/cxx-modules.cmake\")\n\n");
    std::__cxx11::string::string((string *)local_70,(string *)&this->MainImportFile);
    cmsys::SystemTools::GetFilenamePath
              ((string *)((long)&trampoline_path.field_2 + 8),(string *)local_70);
    std::__cxx11::string::operator=
              ((string *)local_70,(string *)(trampoline_path.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(trampoline_path.field_2._M_local_buf + 8));
    cmAlphaNum::cmAlphaNum(&local_e0,(string *)local_70);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&ap.field_0x260,'/');
    cmStrCat<std::__cxx11::string,char[19]>
              ((string *)local_b0,&local_e0,(cmAlphaNum *)&ap.field_0x260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38,
               (char (*) [19])"/cxx-modules.cmake");
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_378,(string *)local_b0,true,None);
    cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_378,true);
    (*this->_vptr_cmExportFileGenerator[0x16])(this,local_378);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_378);
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExportFileGenerator::GenerateCxxModuleInformation(std::ostream& os)
{
  auto const cxx_module_dirname = this->GetCxxModulesDirectory();
  if (cxx_module_dirname.empty()) {
    return;
  }

  // Write the include.
  os << "# Include C++ module properties\n"
     << "include(\"${CMAKE_CURRENT_LIST_DIR}/" << cxx_module_dirname
     << "/cxx-modules.cmake\")\n\n";

  // Get the path to the file we're going to write.
  std::string path = this->MainImportFile;
  path = cmSystemTools::GetFilenamePath(path);
  auto trampoline_path =
    cmStrCat(path, '/', cxx_module_dirname, "/cxx-modules.cmake");

  // Include all configuration-specific include files.
  cmGeneratedFileStream ap(trampoline_path, true);
  ap.SetCopyIfDifferent(true);

  this->GenerateCxxModuleConfigInformation(ap);
}